

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O2

void demmt_memory_dump(mmt_memory_dump_prefix *d,mmt_buf *b,void *state)

{
  ulong uVar1;
  
  if (indent_logs == 0) {
    fprintf(_stdout,"LOG: memory dump, addr: 0x%016lx, txt: \"%s\", data.len: %d, data:",d->addr,
            d + 1,(ulong)b->len);
  }
  else {
    fprintf(_stdout,"%64smemory dump, addr: 0x%016lx, txt: \"%s\", data.len: %d, data:"," ");
  }
  for (uVar1 = 0; uVar1 < b->len >> 2; uVar1 = uVar1 + 1) {
    fprintf(_stdout," 0x%08x",(ulong)b[uVar1 + 1].len);
  }
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

void demmt_memory_dump(struct mmt_memory_dump_prefix *d, struct mmt_buf *b, void *state)
{
	// dead code, because memory dumps are passed to ioctl_pre / ioctl_post handlers
	int i;
	mmt_log("memory dump, addr: 0x%016" PRIx64 ", txt: \"%s\", data.len: %d, data:", d->addr, d->str.data, b->len);

	for (i = 0; i < b->len / 4; ++i)
		mmt_log_cont(" 0x%08x", ((uint32_t *)b->data)[i]);
	mmt_log_cont_nl();
}